

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslateEH.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
wasm::anon_unknown_157::TranslateToExnref::ExnrefLocalAssigner::getExnrefLocal
          (ExnrefLocalAssigner *this,Name rethrowTarget)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_38;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_30;
  const_iterator it;
  ExnrefLocalAssigner *this_local;
  Name rethrowTarget_local;
  
  rethrowTarget_local.super_IString.str._M_len = rethrowTarget.super_IString.str._M_str;
  this_local = rethrowTarget.super_IString.str._M_len;
  it.super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>)this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
       ::find(&this->rethrowTargetToExnrefLocal,(key_type *)&this_local);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
       ::end(&this->rethrowTargetToExnrefLocal);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (bVar1) {
    std::optional<unsigned_int>::optional
              ((optional<unsigned_int> *)&rethrowTarget_local.super_IString.str._M_str);
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>::
             operator->((_Node_const_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>
                         *)&local_30);
    std::optional<unsigned_int>::optional<const_unsigned_int_&,_true>
              ((optional<unsigned_int> *)&rethrowTarget_local.super_IString.str._M_str,
               &pvVar2->second);
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)rethrowTarget_local.super_IString.str._M_str;
}

Assistant:

std::optional<Index> getExnrefLocal(Name rethrowTarget) const {
      auto it = rethrowTargetToExnrefLocal.find(rethrowTarget);
      if (it == rethrowTargetToExnrefLocal.end()) {
        return {};
      } else {
        return it->second;
      }
    }